

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_queue_stdlib.cc
# Opt level: O1

void __thiscall dd::TaskQueueStdlib::ProcessTasks(TaskQueueStdlib *this)

{
  bool bVar1;
  unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_> uVar2;
  int iVar3;
  pointer __p;
  NextTask task;
  NextTask local_40;
  
  Event::Set(&this->_started);
  do {
    GetNextTask(&local_40,this);
    uVar2._M_t.super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>._M_t.
    super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
    super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl =
         (__uniq_ptr_data<dd::QueuedTask,_std::default_delete<dd::QueuedTask>,_true,_true>)
         (__uniq_ptr_data<dd::QueuedTask,_std::default_delete<dd::QueuedTask>,_true,_true>)
         local_40._run_task;
    bVar1 = local_40._final_task;
    if (local_40._final_task == false) {
      if (local_40._run_task._M_t.
          super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>._M_t.
          super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
          super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>)0x0) {
        Event::Wait(&this->_flag_notify,
                    -(uint)(local_40._sleep_time_ms == 0) | (uint)local_40._sleep_time_ms,
                    -(uint)((uint)local_40._sleep_time_ms != 0xffffffff &&
                           local_40._sleep_time_ms != 0) | 3000);
      }
      else {
        local_40._run_task._M_t.
        super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>._M_t.
        super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
        super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl =
             (__uniq_ptr_data<dd::QueuedTask,_std::default_delete<dd::QueuedTask>,_true,_true>)
             (__uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>)0x0;
        iVar3 = (*(*(_func_int ***)
                    uVar2._M_t.
                    super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>._M_t
                    .super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
                    super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl)[2])
                          (uVar2._M_t.
                           super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>
                           .super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl);
        if ((char)iVar3 != '\0') {
          (*(*(_func_int ***)
              uVar2._M_t.super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>
              ._M_t.super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
              super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl)[1])
                    (uVar2._M_t.
                     super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
                     super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl);
        }
      }
    }
    if (local_40._run_task._M_t.
        super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>._M_t.
        super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
        super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>)0x0) {
      (**(code **)(*(long *)local_40._run_task._M_t.
                            super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>
                            .super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl + 8))();
    }
  } while (bVar1 == false);
  DrainTasks(this);
  Event::Set(&this->_stopped);
  return;
}

Assistant:

void TaskQueueStdlib::ProcessTasks()
	{
		_started.Set();
		while (true) {
			auto task = GetNextTask();
			if (task._final_task)
				break;
			if (task._run_task) {
				QueuedTask* release_ptr = task._run_task.release();
				if (release_ptr->Run())
					delete release_ptr;
				continue;
			}

			if (0 == task._sleep_time_ms)
				_flag_notify.Wait(Event::kForever);
			else
				_flag_notify.Wait(task._sleep_time_ms);
		}
		DrainTasks();
		_stopped.Set();
	}